

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon.c
# Opt level: O1

_Bool borg_think_dungeon_munchkin(void)

{
  uint8_t uVar1;
  short sVar2;
  borg_grid *pbVar3;
  loc_conflict grid1;
  loc_conflict grid1_00;
  loc_conflict grid1_01;
  loc_conflict grid1_02;
  chunk_conflict *c;
  int *piVar4;
  _Bool _Var5;
  _Bool _Var6;
  borg_need bVar7;
  wchar_t wVar9;
  square *psVar10;
  loc_conflict lVar11;
  wchar_t wVar8;
  loc_conflict lVar12;
  long lVar13;
  loc lVar14;
  wchar_t wVar15;
  long lVar16;
  short sVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  keycode_t k;
  char *pcVar21;
  wchar_t wVar22;
  borg_grid *pbVar23;
  wchar_t local_48;
  
  pbVar23 = borg_grids[borg.c.y] + borg.c.x;
  lVar14.y = borg.c.y;
  lVar14.x = borg.c.x;
  psVar10 = square(cave,lVar14);
  uVar1 = psVar10->feat;
  borg_notice(true);
  piVar4 = borg.trait;
  if ((borg.trait[0x69] == 0) || (borg.trait[0x6c] != 0)) {
    pcVar21 = "# Leaving munchkin Mode. (Town or Weak)";
LAB_00249736:
    borg_note(pcVar21);
    borg.munchkin_mode = false;
    return false;
  }
  if (uVar1 == '\x05') {
    if (pbVar23->feat != '\x05') {
      sVar17 = track_less.num;
      uVar18 = 0;
      if (0 < sVar17) {
        uVar18 = track_less._0_4_;
      }
      if ((-1 < sVar17) && ((short)uVar18 < track_less.size)) {
        uVar20 = (ulong)((uVar18 & 0xffff) << 2);
        *(int *)((long)track_less.x + uVar20) = borg.c.x;
        *(int *)((long)track_less.y + uVar20) = borg.c.y;
        track_less.num = sVar17 + 1;
      }
      pbVar23->feat = '\x05';
    }
  }
  else if ((uVar1 == '\x06') && (pbVar23->feat != '\x06')) {
    uVar18 = (uint)track_more.num;
    if (track_more.num < 1) {
      uVar20 = 0;
    }
    else {
      uVar20 = 0;
      do {
        if ((track_more.x[uVar20] == borg.c.x) && (track_more.y[uVar20] == borg.c.y))
        goto LAB_002497ac;
        uVar20 = uVar20 + 1;
      } while (uVar18 != uVar20);
      uVar20 = (ulong)uVar18;
    }
LAB_002497ac:
    if (((uint)uVar20 == uVar18) && ((int)(uint)uVar20 < (int)track_more.size)) {
      track_more.x[uVar20 & 0xffffffff] = borg.c.x;
      track_more.y[uVar20 & 0xffffffff] = borg.c.y;
      track_more.num = track_more.num + 1;
    }
    pbVar23->feat = '\x06';
  }
  if (track_more.num == 0 && piVar4[0x69] == 1) {
    borg.munchkin_mode = false;
    return false;
  }
  if (track_more.num == 0 && track_less.num == 0) {
    pcVar21 = "# Leaving Munchkin Mode. (No Stairs seen)";
    goto LAB_00249736;
  }
  bVar7 = borg_maintain_light();
  if (bVar7 == BORG_MET_NEED) {
    return true;
  }
  if (bVar7 == BORG_UNMET_NEED) {
    borg_note("# Munchkin. (need fuel)");
  }
  if (borg.trait[0x1a] == 0) {
    borg_note("# No Light at all.");
  }
  _Var5 = borg_check_rest(borg.c.y,borg.c.x);
  _Var6 = borg_munchkin_mage();
  if (_Var6) {
    return true;
  }
  _Var6 = borg_munchkin_melee();
  if (_Var6) {
    return true;
  }
  if ((_Var5) && (_Var6 = borg_use_things(), _Var6)) {
    return true;
  }
  if ((borg.trait[0x6d] != 0) && (_Var6 = borg_use_things(), _Var6)) {
    return true;
  }
  if (_Var5) {
    _Var6 = borg_wear_stuff();
    if (_Var6) {
      return true;
    }
    if (_Var5) {
      _Var6 = borg_remove_stuff();
      if (_Var6) {
        return true;
      }
      if (_Var5) {
        _Var6 = borg_drop_junk();
        if (_Var6) {
          return true;
        }
        if ((_Var5) && (_Var6 = borg_play_magic(true), _Var6)) {
          return true;
        }
      }
    }
  }
  _Var6 = borg_flow_old(L'\x02');
  if (_Var6) {
    return true;
  }
  if (_Var5) {
    _Var6 = borg_flow_take_lunal(true,L'\x05');
    if (_Var6) {
      return true;
    }
    if ((_Var5) && (_Var6 = borg_recover(), _Var6)) {
      return true;
    }
  }
  borg_note("# Fleeing level. Munchkin Mode");
  borg.goal.fleeing_munchkin = true;
  borg.goal.fleeing = true;
  wVar22 = L'\b';
  if (borg.trait[0x69] < 0xb) {
    wVar22 = (borg.trait[0x23] - borg.trait[0x69]) + L'\b';
  }
  local_48 = L'\xffffffff';
  wVar15 = wVar22;
  if (((track_less.num == 0) ||
      (borg_items[((ulong)z_info->pack_size - (long)borg.trait[0x9e]) + -2].iqty == '\0')) ||
     ((!_Var5 && ((pbVar23->feat != '\x05' && (borg.trait[0x1a] != 0)))))) {
LAB_00249a3b:
    if (((track_less.num != 0) && (borg_cfg[3] < borg.trait[0x69])) &&
       ((_Var5 || (pbVar23->feat == '\x05')))) {
      lVar16 = (long)borg.c.x;
      pbVar3 = borg_grids[borg.c.y];
      if (track_less.num < 1) {
        local_48 = L'\xffffffff';
      }
      else {
        local_48 = L'\xffffffff';
        lVar19 = 0;
        do {
          wVar22 = track_less.x[lVar19];
          wVar9 = track_less.y[lVar19];
          lVar11 = loc(wVar22,wVar9);
          lVar12.y = borg.c.y;
          lVar12.x = borg.c.x;
          wVar8 = distance(lVar12,lVar11);
          _Var6 = borg_projectable(wVar9,wVar22,borg.c.y,borg.c.x);
          wVar22 = wVar8;
          if (local_48 < wVar8) {
            wVar22 = local_48;
          }
          if (local_48 == L'\xffffffff') {
            wVar22 = wVar8;
          }
          if (_Var6) {
            local_48 = wVar22;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < track_less.num);
      }
      if ((!_Var5 || wVar15 <= local_48) && (pbVar3[lVar16].feat != '\x05')) goto LAB_00249d0b;
      borg_note("# Munchkin Mode.  Power Climb. ");
      borg.goal.less = true;
      _Var6 = borg_flow_old(L'\a');
      if (_Var6) {
        return true;
      }
      _Var6 = borg_flow_stair_less(7,true);
      if (!_Var6) {
        if ((pbVar3[lVar16].feat == '\x05') && ((player->opts).opt[0x20] == false))
        goto LAB_0024a25f;
        goto LAB_00249d0b;
      }
LAB_00249fb0:
      pcVar21 = "# Looking for stairs. Munchkin Mode.";
LAB_00249fb7:
      borg_note(pcVar21);
      return true;
    }
LAB_00249d0b:
    if (((track_more.num == 0) || (borg_cfg[3] <= borg.trait[0x69])) ||
       ((!_Var5 && (pbVar23->feat != '\x06')))) {
LAB_00249e9f:
      if (((track_less.num != 0) && (_Var5 && borg.trait[0x69] != 1)) || (pbVar23->feat == '\x05'))
      {
        lVar16 = (long)borg.c.x;
        pbVar3 = borg_grids[borg.c.y];
        if (0 < track_less.num) {
          lVar19 = 0;
          do {
            wVar22 = track_less.x[lVar19];
            wVar9 = track_less.y[lVar19];
            lVar11 = loc(wVar22,wVar9);
            grid1_00.y = borg.c.y;
            grid1_00.x = borg.c.x;
            wVar8 = distance(grid1_00,lVar11);
            _Var6 = borg_projectable(wVar9,wVar22,borg.c.y,borg.c.x);
            wVar22 = wVar8;
            if (local_48 < wVar8) {
              wVar22 = local_48;
            }
            if (local_48 == L'\xffffffff') {
              wVar22 = wVar8;
            }
            if (_Var6) {
              local_48 = wVar22;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < track_less.num);
        }
        if ((_Var5 && local_48 < wVar15) || (pbVar3[lVar16].feat == '\x05')) {
          borg_note("# Munchkin Mode.  Power Climb. ");
          borg.goal.less = true;
          _Var6 = borg_flow_old(L'\a');
          if (_Var6) {
            return true;
          }
          _Var6 = borg_flow_stair_less(7,true);
          if (_Var6) goto LAB_00249fb0;
          if ((pbVar3[lVar16].feat == '\x05') && ((player->opts).opt[0x20] == false))
          goto LAB_0024a25f;
        }
      }
      if (_Var5 && borg.trait[0x69] < 2) {
LAB_00249ffd:
        borg_note("Leaving Munchkin Mode. (End of Mode)");
        borg.munchkin_mode = false;
        borg.goal.fleeing = false;
        borg.goal.fleeing_munchkin = false;
        return false;
      }
      _Var5 = borg_flow_old(L'\a');
      if (_Var5) {
        return true;
      }
      borg_note("# Munchkin Mode.  Any Stair. ");
      lVar16 = 0;
      do {
        c = cave;
        lVar19 = (long)borg.c.y;
        sVar17 = ddy_ddd[lVar16];
        lVar13 = (long)borg.c.x;
        sVar2 = ddx_ddd[lVar16];
        lVar14 = (loc)loc((int)(sVar2 + lVar13),(int)(sVar17 + lVar19));
        _Var5 = square_in_bounds(c,lVar14);
        if ((_Var5) &&
           (pbVar23 = borg_grids[sVar17 + lVar19] + sVar2 + lVar13, pbVar23->kill != '\0')) {
          if (0 < track_less.num) {
            lVar19 = 0;
            do {
              wVar22 = track_less.x[lVar19];
              wVar15 = track_less.y[lVar19];
              lVar11 = loc(wVar22,wVar15);
              grid1_01.y = borg.c.y;
              grid1_01.x = borg.c.x;
              wVar9 = distance(grid1_01,lVar11);
              _Var5 = borg_projectable(wVar15,wVar22,borg.c.y,borg.c.x);
              wVar22 = wVar9;
              if (local_48 < wVar9) {
                wVar22 = local_48;
              }
              if (local_48 == L'\xffffffff') {
                wVar22 = wVar9;
              }
              if (!_Var5) {
                wVar22 = local_48;
              }
              local_48 = wVar22;
              lVar19 = lVar19 + 1;
            } while (lVar19 < track_less.num);
          }
          if (0 < track_more.num) {
            lVar19 = 0;
            do {
              wVar22 = track_more.x[lVar19];
              wVar15 = track_more.y[lVar19];
              lVar11 = loc(wVar22,wVar15);
              grid1_02.y = borg.c.y;
              grid1_02.x = borg.c.x;
              wVar9 = distance(grid1_02,lVar11);
              _Var5 = borg_projectable(wVar15,wVar22,borg.c.y,borg.c.x);
              wVar22 = wVar9;
              if (local_48 < wVar9) {
                wVar22 = local_48;
              }
              if (local_48 == L'\xffffffff') {
                wVar22 = wVar9;
              }
              if (_Var5) {
                local_48 = wVar22;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < track_more.num);
          }
          if (local_48 < L'\x04') {
            _Var5 = borg_flow_stair_both(7,false);
          }
          else {
            _Var5 = borg_attack(false);
          }
          if (_Var5 != false) {
            return true;
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 8);
      _Var5 = borg_flow_stair_both(7,false);
      if (_Var5) {
        return true;
      }
      if (pbVar23->feat != '\x06') {
        if ((pbVar23->feat != '\x05') || ((player->opts).opt[0x20] != false)) goto LAB_00249ffd;
        goto LAB_0024a25f;
      }
    }
    else {
      if (0 < track_more.num) {
        borg_note("# Munchkin Mode: I know of a down stair.");
      }
      if (track_more.num < 1) {
        local_48 = L'\xffffffff';
      }
      else {
        local_48 = L'\xffffffff';
        lVar16 = 0;
        do {
          wVar22 = track_more.x[lVar16];
          wVar9 = track_more.y[lVar16];
          lVar11 = loc(wVar22,wVar9);
          grid1.y = borg.c.y;
          grid1.x = borg.c.x;
          wVar8 = distance(grid1,lVar11);
          _Var6 = borg_projectable(wVar9,wVar22,borg.c.y,borg.c.x);
          wVar22 = wVar8;
          if (local_48 < wVar8) {
            wVar22 = local_48;
          }
          if (local_48 == L'\xffffffff') {
            wVar22 = wVar8;
          }
          if (_Var6) {
            local_48 = wVar22;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < track_more.num);
      }
      if (((!_Var5 || wVar15 <= local_48) && (pbVar23->feat != '\x06')) && (borg.trait[0x69] != 1))
      goto LAB_00249e9f;
      borg_note("# Munchkin Mode.  Power Diving. ");
      _Var6 = borg_flow_old(L'\a');
      if (_Var6) {
        return true;
      }
      _Var6 = borg_flow_stair_more(7,true,false);
      if (_Var6) {
        return true;
      }
      if (pbVar23->feat != '\x06') goto LAB_00249e9f;
    }
    k = 0x3e;
  }
  else {
    lVar16 = (long)borg.c.x;
    pbVar3 = borg_grids[borg.c.y];
    if (0 < track_less.num) {
      lVar19 = 0;
      do {
        wVar15 = track_less.x[lVar19];
        wVar9 = track_less.y[lVar19];
        lVar12 = loc(wVar15,wVar9);
        lVar11.y = borg.c.y;
        lVar11.x = borg.c.x;
        wVar8 = distance(lVar11,lVar12);
        _Var6 = borg_projectable(wVar9,wVar15,borg.c.y,borg.c.x);
        wVar15 = wVar8;
        if (local_48 < wVar8) {
          wVar15 = local_48;
        }
        if (local_48 == L'\xffffffff') {
          wVar15 = wVar8;
        }
        if (!_Var6) {
          wVar15 = local_48;
        }
        local_48 = wVar15;
        lVar19 = lVar19 + 1;
      } while (lVar19 < track_less.num);
    }
    wVar15 = L'\x14';
    if (borg.trait[0x69] != 1) {
      wVar15 = wVar22;
    }
    if (track_less.num == 0) {
      wVar15 = wVar22;
    }
    if ((!_Var5 || wVar15 <= local_48) && (pbVar3[lVar16].feat != '\x05')) goto LAB_00249a3b;
    borg_note("# Munchkin Mode.  Power Climb (needing to sell). ");
    borg.goal.less = true;
    _Var6 = borg_flow_old(L'\a');
    if (_Var6) {
      return true;
    }
    _Var6 = borg_flow_stair_less(7,true);
    if (_Var6) {
      pcVar21 = "# Looking for stairs. Munchkin Mode (needing to sell).";
      goto LAB_00249fb7;
    }
    if ((pbVar3[lVar16].feat != '\x05') || ((player->opts).opt[0x20] != false)) goto LAB_00249a3b;
LAB_0024a25f:
    k = 0x3c;
  }
  borg_keypress(k);
  return true;
}

Assistant:

static bool borg_think_dungeon_munchkin(void)
{
    bool safe_place = false;
    int  bb_j       = z_info->max_range;
    int  j, b_j = -1;
    int  i, ii, x, y;
    int  closeness = 8;

    borg_grid *ag  = &borg_grids[borg.c.y][borg.c.x];

    uint8_t feat   = square(cave, borg.c)->feat;

    enum borg_need need;

    /* examine equipment and swaps */
    borg_notice(true);

    /* Not if starving or in town */
    if (borg.trait[BI_CDEPTH] == 0 || borg.trait[BI_ISWEAK]) {
        borg_note("# Leaving munchkin Mode. (Town or Weak)");
        borg.munchkin_mode = false;
        return false;
    }

    /* if borg is just starting on this level, he may not
     * know that a stair is under him.  Cheat to see if one is
     * there
     */
    if (feat == FEAT_MORE && ag->feat != FEAT_MORE) {

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            /* We already knew about that one */
            if ((track_more.x[i] == borg.c.x) && (track_more.y[i] == borg.c.y))
                break;
        }

        /* Track the newly discovered "down stairs" */
        if ((i == track_more.num) && (i < track_more.size)) {
            track_more.x[i] = borg.c.x;
            track_more.y[i] = borg.c.y;
            track_more.num++;
        }
        /* tell the array */
        ag->feat = FEAT_MORE;
    }

    if (feat == FEAT_LESS && ag->feat != FEAT_LESS) {

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            /* We already knew about this one */
            if ((track_less.x[i] == borg.c.x) && (track_less.y[i] == borg.c.y))
                continue;
        }

        /* Track the newly discovered "up stairs" */
        if ((i == track_less.num) && (i < track_less.size)) {
            track_less.x[i] = borg.c.x;
            track_less.y[i] = borg.c.y;
            track_less.num++;
        }

        /* Tell the array */
        ag->feat = FEAT_LESS;
    }

    /* Act normal on 1 unless stairs are seen*/
    if (borg.trait[BI_CDEPTH] == 1 && track_more.num == 0) {
        borg.munchkin_mode = false;
        return false;
    }

    /* If no down stair is known, act normal */
    if (track_more.num == 0 && track_less.num == 0) {
        borg_note("# Leaving Munchkin Mode. (No Stairs seen)");
        borg.munchkin_mode = false;
        return false;
    }

    /** First deal with staying alive **/

    /* Hack -- require light */
    need = borg_maintain_light();
    if (need == BORG_MET_NEED)
        return true;
    else if (need == BORG_UNMET_NEED)
        borg_note("# Munchkin. (need fuel)");

    /* No Light at all */
    if (borg.trait[BI_LIGHT] == 0) {
        borg_note("# No Light at all.");
    }

    /* Define if safe_place is true or not */
    safe_place = borg_check_rest(borg.c.y, borg.c.x);

    /* Can do a little attacking. */
    if (borg_munchkin_mage())
        return true;
    if (borg_munchkin_melee())
        return true;

    /* Consume needed things */
    if (safe_place && borg_use_things())
        return true;

    /* Consume needed things */
    if (borg.trait[BI_ISHUNGRY] && borg_use_things())
        return true;

    /* Wear stuff and see if it's good */
    if (safe_place && borg_wear_stuff())
        return true;

    if (safe_place && borg_remove_stuff())
        return true;

    /* Crush junk if convenient */
    if (safe_place && borg_drop_junk())
        return true;

    /* Learn learn and test useful spells */
    if (safe_place && borg_play_magic(true))
        return true;

    /** Track down some interesting gear **/
    /* XXX Should we allow him great flexibility in retrieving loot? (not always
     * safe?)*/
    /* Continue flowing towards objects */
    if (borg_flow_old(GOAL_TAKE))
        return true;

    /* Borg may be off the stair and a monster showed up. */

    /* Find a (viewable) object */
    if (safe_place && borg_flow_take_lunal(true, 5))
        return true;

    /* Recover from any nasty condition */
    if (safe_place && borg_recover())
        return true;

    /*leave level right away. */
    borg_note("# Fleeing level. Munchkin Mode");
    borg.goal.fleeing_munchkin = true;
    borg.goal.fleeing          = true;

    /* Increase the range of the borg a bit */
    if (borg.trait[BI_CDEPTH] <= 10)
        closeness
            += (borg.trait[BI_CLEVEL] - 10) + (10 - borg.trait[BI_CDEPTH]);

    /* Full of Items - Going up */
    if (track_less.num && (borg_items[PACK_SLOTS - 2].iqty)
        && (safe_place || ag->feat == FEAT_LESS
            || borg.trait[BI_LIGHT] == 0)) {
        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if on depth 1, try to venture more to get back to town */
        if (borg.trait[BI_CDEPTH] == 1) {
            if (track_less.num) {
                closeness = 20;
            }
        }

        /* if the upstair is close and safe path, continue */
        if ((b_j < closeness && safe_place) || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Munchkin Mode.  Power Climb (needing to sell). ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, true)) {
                borg_note(
                    "# Looking for stairs. Munchkin Mode (needing to sell).");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Too deep. trying to gradually move shallow.  Going up */
    if ((track_less.num
            && borg.trait[BI_CDEPTH] > borg_cfg[BORG_MUNCHKIN_DEPTH])
        && (safe_place || ag->feat == FEAT_LESS)) {

        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Reset */
        b_j = -1;

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
            if (b_j < bb_j)
                bb_j = b_j;
        }

        /* if the upstair is close and safe path, continue */
        if ((b_j < closeness && safe_place) || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Munchkin Mode.  Power Climb. ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, true)) {
                borg_note("# Looking for stairs. Munchkin Mode.");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Going down */
    if ((track_more.num
            && borg.trait[BI_CDEPTH] < borg_cfg[BORG_MUNCHKIN_DEPTH])
        && (safe_place || ag->feat == FEAT_MORE)) {
        /* Reset */
        b_j = -1;

        if (track_more.num >= 1)
            borg_note("# Munchkin Mode: I know of a down stair.");

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            x = track_more.x[i];
            y = track_more.y[i];

            /* How far is the nearest down stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the downstair is close and path is safe, continue on */
        if ((b_j < closeness && safe_place) || ag->feat == FEAT_MORE
            || borg.trait[BI_CDEPTH] == 1) {
            /* Note */
            borg_note("# Munchkin Mode.  Power Diving. ");

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to DownStair */
            if (borg_flow_stair_more(GOAL_FLEE, true, false))
                return true;

            /* if standing on a stair */
            if (ag->feat == FEAT_MORE) {
                /* Take the DownStair */
                borg_keypress('>');

                return true;
            }
        }
    }

    /* Going up */
    if ((track_less.num && borg.trait[BI_CDEPTH] != 1 && safe_place)
        || ag->feat == FEAT_LESS) {
        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the upstair is close and safe path, continue */
        if ((b_j < closeness && safe_place) || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Munchkin Mode.  Power Climb. ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, true)) {
                borg_note("# Looking for stairs. Munchkin Mode.");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Special case where the borg is off a stair and there
     * is a monster in LOS.  He could freeze and unhook, or
     * move to the closest stair and risk the run.
     */
    if (borg.trait[BI_CDEPTH] >= 2 || !safe_place) {
        /* Continue fleeing to stair */
        if (borg_flow_old(GOAL_FLEE))
            return true;

        /* Note */
        borg_note("# Munchkin Mode.  Any Stair. ");

        /* Adjacent Monster.  Either attack it, or try to outrun it */
        for (i = 0; i < 8; i++) {
            y = borg.c.y + ddy_ddd[i];
            x = borg.c.x + ddx_ddd[i];

            /* Bounds check */
            if (!square_in_bounds(cave, loc(x, y)))
                continue;

            /* Get the grid */
            ag = &borg_grids[y][x];

            /* Monster is adjacent to the borg */
            if (ag->kill) {
                /* Check for an existing "up stairs" */
                for (ii = 0; ii < track_less.num; ii++) {
                    x = track_less.x[ii];
                    y = track_less.y[ii];

                    /* How far is the nearest up stairs */
                    j = distance(borg.c, loc(x, y));

                    /* Is it reachable or behind a wall? */
                    if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                        continue;

                    /* skip the far ones */
                    if (b_j <= j && b_j != -1)
                        continue;

                    /* track it */
                    b_j = j;
                }

                /* Check for an existing "down stairs" */
                for (ii = 0; ii < track_more.num; ii++) {
                    x = track_more.x[ii];
                    y = track_more.y[ii];

                    /* How far is the nearest down stairs */
                    j = distance(borg.c, loc(x, y));

                    /* Is it reachable or behind a wall? */
                    if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                        continue;

                    /* skip the far ones */
                    if (b_j <= j && b_j != -1)
                        continue;

                    /* track it */
                    b_j = j;
                }

                /* Can the borg risk the run? */
                if (b_j <= 3) {
                    /* Try to find some stairs */
                    if (borg_flow_stair_both(GOAL_FLEE, false))
                        return true;
                } else {
                    /* Try to kill it */
                    if (borg_attack(false))
                        return true;
                }
            } /* Adjacent to kill */
        } /* Scanning neighboring grids */

        /* Try to find some stairs */
        if (borg_flow_stair_both(GOAL_FLEE, false))
            return true;
        if (ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
            /* Take the Up Stair */
            borg_keypress('<');
            return true;
        }
        if (ag->feat == FEAT_MORE) {
            /* Take the Stair */
            borg_keypress('>');
            return true;
        }
    }

    /* return to normal borg_think_dungeon */
    borg_note("Leaving Munchkin Mode. (End of Mode)");
    borg.munchkin_mode = false;
    borg.goal.fleeing = borg.goal.fleeing_munchkin = false;
    return false;
}